

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::verifyResults(InterCallTestCase *this)

{
  code *pcVar1;
  char cVar2;
  int iVar3;
  deUint32 err;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  size_type sVar6;
  reference pvVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  reference pvVar10;
  TestError *this_00;
  MessageBuilder local_808;
  MessageBuilder local_688;
  MessageBuilder local_508;
  MessageBuilder local_388;
  int local_208;
  undefined1 local_202;
  allocator<char> local_201;
  int ndx;
  byte local_1da;
  allocator<int> local_1d9;
  undefined1 local_1d8 [6];
  bool error;
  vector<int,_std::allocator<int>_> results;
  void *mapped;
  Functions *gl;
  int numErrorsLogged;
  int errorFloodThreshold;
  int step;
  MessageBuilder local_198;
  undefined1 local_16;
  byte local_15;
  int local_14;
  bool anyResult;
  bool allResultsOk;
  InterCallTestCase *pIStack_10;
  int resultBufferFriendlyName;
  InterCallTestCase *this_local;
  long lVar9;
  
  local_14 = 0;
  local_15 = 1;
  local_16 = 0;
  pIStack_10 = this;
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_198,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_198,(char (*) [33])"Reading verifier program results");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  numErrorsLogged = 0;
  do {
    sVar6 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
            ::size(&this->m_cmds);
    if ((int)sVar6 <= numErrorsLogged) {
      return (bool)(local_15 & 1);
    }
    gl._0_4_ = 0;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_operationResultStorages,(long)numErrorsLogged);
    if (*pvVar7 != 0) {
      pRVar8 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      iVar3 = (*pRVar8->_vptr_RenderContext[3])();
      lVar9 = CONCAT44(extraout_var,iVar3);
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      iVar3 = this->m_invocationGridSize;
      std::allocator<int>::allocator(&local_1d9);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_1d8,(long)(iVar3 * iVar3),&local_1d9);
      std::allocator<int>::~allocator(&local_1d9);
      local_1da = 0;
      local_16 = 1;
      pcVar1 = *(code **)(lVar9 + 0x40);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_operationResultStorages,(long)numErrorsLogged);
      (*pcVar1)(0x90d2,*pvVar7);
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)(**(code **)(lVar9 + 0xd00))
                              (0x90d2,0,(long)(this->m_invocationGridSize *
                                              this->m_invocationGridSize) << 2,1);
      err = (**(code **)(lVar9 + 0x800))();
      glu::checkError(err,"map buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                      ,0x57e);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_1d8,0);
      ::deMemcpy(pvVar10,results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                 (long)(this->m_invocationGridSize * this->m_invocationGridSize) << 2);
      cVar2 = (**(code **)(lVar9 + 0x1670))(0x90d2);
      if (cVar2 != '\x01') {
        local_202 = 1;
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ndx,"memory map store corrupted",&local_201);
        tcu::TestError::TestError(this_00,(string *)&ndx);
        local_202 = 0;
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_208 = 0;
      while( true ) {
        iVar3 = local_208;
        sVar6 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_1d8);
        if ((int)sVar6 <= iVar3) break;
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_1d8,(long)local_208);
        if (*pvVar10 != 1) {
          local_1da = 1;
          if ((int)gl == 0) {
            pTVar4 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_388,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar5 = tcu::MessageBuilder::operator<<(&local_388,(char (*) [17])"Result storage #");
            local_14 = local_14 + 1;
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_14);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [33])0x2c11024);
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_388);
          }
          if (4 < (int)gl) {
            pTVar4 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_688,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (&local_688,
                                (char (*) [47])"\t-- too many errors, skipping verification --\n");
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_688);
            break;
          }
          pTVar4 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_508,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<(&local_508,(char (*) [17])"\tError at index ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_208);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [19])": expected 1, got ");
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_1d8,(long)local_208);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar10);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2c89945);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_508);
          gl._0_4_ = (int)gl + 1;
        }
        local_208 = local_208 + 1;
      }
      if ((local_1da & 1) == 0) {
        pTVar4 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_808,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_808,(char (*) [17])"Result storage #");
        local_14 = local_14 + 1;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_14);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [5])0x2c3ee1f);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_808);
      }
      else {
        local_15 = 0;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_1d8);
    }
    numErrorsLogged = numErrorsLogged + 1;
  } while( true );
}

Assistant:

bool InterCallTestCase::verifyResults (void)
{
	int		resultBufferFriendlyName	= 0;
	bool	allResultsOk				= true;
	bool	anyResult					= false;

	m_testCtx.getLog() << tcu::TestLog::Message << "Reading verifier program results" << tcu::TestLog::EndMessage;

	for (int step = 0; step < (int)m_cmds.size(); ++step)
	{
		const int	errorFloodThreshold	= 5;
		int			numErrorsLogged		= 0;

		if (m_operationResultStorages[step])
		{
			const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
			const void*				mapped	= DE_NULL;
			std::vector<deInt32>	results	(m_invocationGridSize * m_invocationGridSize);
			bool					error	= false;

			anyResult = true;

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_operationResultStorages[step]);
			mapped = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, m_invocationGridSize * m_invocationGridSize * sizeof(deUint32), GL_MAP_READ_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "map buffer");

			// copy to properly aligned array
			deMemcpy(&results[0], mapped, m_invocationGridSize * m_invocationGridSize * sizeof(deUint32));

			if (gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER) != GL_TRUE)
				throw tcu::TestError("memory map store corrupted");

			// check the results
			for (int ndx = 0; ndx < (int)results.size(); ++ndx)
			{
				if (results[ndx] != 1)
				{
					error = true;

					if (numErrorsLogged == 0)
						m_testCtx.getLog() << tcu::TestLog::Message << "Result storage #" << ++resultBufferFriendlyName << " failed, got unexpected values.\n" << tcu::TestLog::EndMessage;
					if (numErrorsLogged++ < errorFloodThreshold)
						m_testCtx.getLog() << tcu::TestLog::Message << "	Error at index " << ndx << ": expected 1, got " << results[ndx] << ".\n" << tcu::TestLog::EndMessage;
					else
					{
						// after N errors, no point continuing verification
						m_testCtx.getLog() << tcu::TestLog::Message << "	-- too many errors, skipping verification --\n" << tcu::TestLog::EndMessage;
						break;
					}
				}
			}

			if (error)
			{
				allResultsOk = false;
			}
			else
				m_testCtx.getLog() << tcu::TestLog::Message << "Result storage #" << ++resultBufferFriendlyName << " ok." << tcu::TestLog::EndMessage;
		}
	}

	DE_ASSERT(anyResult);
	DE_UNREF(anyResult);

	return allResultsOk;
}